

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

string * gimage::anon_unknown_17::getTileName
                   (string *__return_storage_ptr__,string *prefix,int trow,int tcol,string *suffix)

{
  long lVar1;
  ostream *poVar2;
  string *psVar3;
  ostringstream ret;
  undefined1 auStack_1b8 [15];
  char local_1a9;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar1 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar1 + 1] == '\0') {
    std::ios::widen((char)auStack_1b8 + (char)lVar1 + '\x10');
    acStack_c8[lVar1 + 1] = '\x01';
  }
  acStack_c8[lVar1] = '0';
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x80;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  local_1a9 = '_';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
  std::ostream::operator<<((ostream *)local_1a8,trow);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0;
  local_1a9 = '_';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
  std::ostream::operator<<((ostream *)local_1a8,tcol);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0;
  local_1a9 = '_';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(suffix->_M_dataplus)._M_p,suffix->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar3 = (string *)std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string getTileName(const std::string &prefix, int trow, int tcol, const std::string &suffix)
{
  std::ostringstream ret;

  ret.fill('0');
  ret << std::right;

  ret << prefix << '_';

  ret.width(2);
  ret << trow;
  ret.width(0);
  ret << '_';
  ret.width(2);
  ret << tcol;
  ret.width(0);

  ret << '_' << suffix;

  return ret.str();
}